

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneCombiner.cpp
# Opt level: O1

void Assimp::SceneCombiner::Copy(aiMetadata **_dest,aiMetadata *src)

{
  uint uVar1;
  aiMetadataEntry *paVar2;
  uint *puVar3;
  undefined8 *puVar4;
  aiMetadata *paVar5;
  aiString *paVar6;
  aiMetadataEntry *paVar7;
  uint *puVar8;
  long lVar9;
  ulong uVar10;
  aiString *paVar11;
  
  if (src != (aiMetadata *)0x0 && _dest != (aiMetadata **)0x0) {
    uVar1 = src->mNumProperties;
    uVar10 = (ulong)uVar1;
    if (uVar10 != 0) {
      paVar5 = (aiMetadata *)operator_new(0x18);
      paVar5->mKeys = (aiString *)0x0;
      paVar5->mValues = (aiMetadataEntry *)0x0;
      paVar5->mNumProperties = uVar1;
      paVar6 = (aiString *)operator_new__(uVar10 * 0x404);
      paVar11 = paVar6;
      do {
        paVar11->length = 0;
        paVar11->data[0] = '\0';
        memset(paVar11->data + 1,0x1b,0x3ff);
        paVar11 = paVar11 + 1;
      } while (paVar11 != paVar6 + uVar10);
      paVar5->mKeys = paVar6;
      uVar10 = (ulong)paVar5->mNumProperties << 4;
      paVar7 = (aiMetadataEntry *)operator_new__(uVar10);
      memset(paVar7,0,uVar10);
      paVar5->mValues = paVar7;
      *_dest = paVar5;
      if ((ulong)src->mNumProperties != 0) {
        paVar11 = src->mKeys;
        paVar6 = paVar5->mKeys;
        lVar9 = (ulong)src->mNumProperties + 1;
        do {
          if (paVar11 != paVar6) {
            uVar1 = paVar11->length;
            paVar6->length = uVar1;
            memcpy(paVar6->data,paVar11->data,(ulong)uVar1);
            paVar6->data[uVar1] = '\0';
          }
          paVar11 = paVar11 + 1;
          paVar6 = paVar6 + 1;
          lVar9 = lVar9 + -1;
        } while (1 < lVar9);
      }
      uVar1 = src->mNumProperties;
      paVar7 = (aiMetadataEntry *)operator_new__((ulong)uVar1 << 4);
      paVar5->mValues = paVar7;
      if ((ulong)uVar1 != 0) {
        lVar9 = 0;
        uVar10 = 0;
        do {
          paVar7 = src->mValues;
          paVar2 = paVar5->mValues;
          *(undefined4 *)((long)&paVar2->mType + lVar9) =
               *(undefined4 *)((long)&paVar7->mType + lVar9);
          switch(*(undefined4 *)((long)&paVar5->mValues->mType + lVar9)) {
          case 0:
            puVar8 = (uint *)operator_new(1);
            *(undefined1 *)puVar8 = **(undefined1 **)((long)&paVar7->mData + lVar9);
            break;
          case 1:
            puVar8 = (uint *)operator_new(4);
            *puVar8 = **(uint **)((long)&paVar7->mData + lVar9);
            break;
          case 2:
            puVar8 = (uint *)operator_new(8);
            *(undefined8 *)puVar8 = **(undefined8 **)((long)&paVar7->mData + lVar9);
            break;
          case 3:
            puVar8 = (uint *)operator_new(4);
            *puVar8 = **(uint **)((long)&paVar7->mData + lVar9);
            break;
          case 4:
            puVar8 = (uint *)operator_new(8);
            *(undefined8 *)puVar8 = **(undefined8 **)((long)&paVar7->mData + lVar9);
            break;
          case 5:
            puVar8 = (uint *)operator_new(0x404);
            puVar3 = *(uint **)((long)&paVar7->mData + lVar9);
            uVar1 = *puVar3;
            if (0x3fe < uVar1) {
              uVar1 = 0x3ff;
            }
            *puVar8 = uVar1;
            memcpy(puVar8 + 1,puVar3 + 1,(ulong)uVar1);
            *(undefined1 *)((long)puVar8 + (ulong)uVar1 + 4) = 0;
            break;
          case 6:
            puVar8 = (uint *)operator_new(0xc);
            puVar4 = *(undefined8 **)((long)&paVar7->mData + lVar9);
            *(undefined8 *)puVar8 = *puVar4;
            puVar8[2] = *(uint *)(puVar4 + 1);
            break;
          default:
            goto switchD_003d0ab1_default;
          }
          *(uint **)((long)&paVar2->mData + lVar9) = puVar8;
switchD_003d0ab1_default:
          uVar10 = uVar10 + 1;
          lVar9 = lVar9 + 0x10;
        } while (uVar10 < src->mNumProperties);
      }
    }
  }
  return;
}

Assistant:

void SceneCombiner::Copy(aiMetadata** _dest, const aiMetadata* src) {
    if ( nullptr == _dest || nullptr == src ) {
        return;
    }

    if ( 0 == src->mNumProperties ) {
        return;
    }

    aiMetadata* dest = *_dest = aiMetadata::Alloc( src->mNumProperties );
    std::copy(src->mKeys, src->mKeys + src->mNumProperties, dest->mKeys);

    dest->mValues = new aiMetadataEntry[src->mNumProperties];
    for (unsigned int i = 0; i < src->mNumProperties; ++i) {
        aiMetadataEntry& in = src->mValues[i];
        aiMetadataEntry& out = dest->mValues[i];
        out.mType = in.mType;
        switch (dest->mValues[i].mType) {
            case AI_BOOL:
                out.mData = new bool(*static_cast<bool*>(in.mData));
                break;
            case AI_INT32:
                out.mData = new int32_t(*static_cast<int32_t*>(in.mData));
                break;
            case AI_UINT64:
                out.mData = new uint64_t(*static_cast<uint64_t*>(in.mData));
                break;
            case AI_FLOAT:
                out.mData = new float(*static_cast<float*>(in.mData));
                break;
            case AI_DOUBLE:
                out.mData = new double(*static_cast<double*>(in.mData));
                break;
            case AI_AISTRING:
                out.mData = new aiString(*static_cast<aiString*>(in.mData));
                break;
            case AI_AIVECTOR3D:
                out.mData = new aiVector3D(*static_cast<aiVector3D*>(in.mData));
                break;
            default:
                ai_assert(false);
                break;
        }
    }
}